

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompress.hpp
# Opt level: O0

void __thiscall
gzip::Decompressor::decompress<std::__cxx11::string>
          (Decompressor *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output,char *data,
          size_t size)

{
  int iVar1;
  runtime_error *prVar2;
  long lVar3;
  allocator local_e9;
  string local_e8 [8];
  string error_msg;
  int ret;
  size_t resize_to;
  size_t size_uncompressed;
  char *pcStack_98;
  int window_bits;
  z_stream inflate_s;
  size_t size_local;
  char *data_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output_local;
  Decompressor *this_local;
  
  inflate_s.state = (internal_state *)0x0;
  inflate_s.zalloc = (alloc_func)0x0;
  inflate_s.zfree = (free_func)0x0;
  inflate_s.next_in._0_4_ = 0;
  pcStack_98 = (char *)0x0;
  inflate_s.reserved = size;
  iVar1 = inflateInit2_(&stack0xffffffffffffff68,0x2f,"1.2.11",0x70);
  if (iVar1 != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"inflate init failed");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcStack_98 = data;
  if ((inflate_s.reserved <= this->max_) &&
     (inflate_s.reserved * 2 < this->max_ || inflate_s.reserved * 2 - this->max_ == 0)) {
    inflate_s.next_in._0_4_ = (undefined4)inflate_s.reserved;
    resize_to = 0;
    while( true ) {
      if (this->max_ < resize_to + inflate_s.reserved * 2) {
        inflateEnd(&stack0xffffffffffffff68);
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar2,
                   "size of output string will use more memory then intended when decompressing");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::resize((ulong)output);
      inflate_s.next_out._0_4_ = (uint)(inflate_s.reserved << 1);
      lVar3 = std::__cxx11::string::operator[]((ulong)output);
      inflate_s.total_in = lVar3 + resize_to;
      iVar1 = inflate(&stack0xffffffffffffff68,4);
      if (((iVar1 != 1) && (iVar1 != 0)) && (iVar1 != -5)) break;
      resize_to = (inflate_s.reserved * 2 - (ulong)(uint)inflate_s.next_out) + resize_to;
      if ((uint)inflate_s.next_out != 0) {
        inflateEnd(&stack0xffffffffffffff68);
        std::__cxx11::string::resize((ulong)output);
        return;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,(char *)inflate_s.total_out,&local_e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    inflateEnd(&stack0xffffffffffffff68);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,local_e8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  inflateEnd(&stack0xffffffffffffff68);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar2,"size may use more memory than intended when decompressing");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void decompress(OutputType& output,
                    const char* data,
                    std::size_t size) const
    {
        z_stream inflate_s;

        inflate_s.zalloc = Z_NULL;
        inflate_s.zfree = Z_NULL;
        inflate_s.opaque = Z_NULL;
        inflate_s.avail_in = 0;
        inflate_s.next_in = Z_NULL;

        // The windowBits parameter is the base two logarithm of the window size (the size of the history buffer).
        // It should be in the range 8..15 for this version of the library.
        // Larger values of this parameter result in better compression at the expense of memory usage.
        // This range of values also changes the decoding type:
        //  -8 to -15 for raw deflate
        //  8 to 15 for zlib
        // (8 to 15) + 16 for gzip
        // (8 to 15) + 32 to automatically detect gzip/zlib header
        constexpr int window_bits = 15 + 32; // auto with windowbits of 15

#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wold-style-cast"
        if (inflateInit2(&inflate_s, window_bits) != Z_OK)
        {
            throw std::runtime_error("inflate init failed");
        }
#pragma GCC diagnostic pop
        inflate_s.next_in = reinterpret_cast<z_const Bytef*>(data);

#ifdef DEBUG
        // Verify if size (long type) input will fit into unsigned int, type used for zlib's avail_in
        std::uint64_t size_64 = size * 2;
        if (size_64 > std::numeric_limits<unsigned int>::max())
        {
            inflateEnd(&inflate_s);
            throw std::runtime_error("size arg is too large to fit into unsigned int type x2");
        }
#endif
        if (size > max_ || (size * 2) > max_)
        {
            inflateEnd(&inflate_s);
            throw std::runtime_error("size may use more memory than intended when decompressing");
        }
        inflate_s.avail_in = static_cast<unsigned int>(size);
        std::size_t size_uncompressed = 0;
        do
        {
            std::size_t resize_to = size_uncompressed + 2 * size;
            if (resize_to > max_)
            {
                inflateEnd(&inflate_s);
                throw std::runtime_error("size of output string will use more memory then intended when decompressing");
            }
            output.resize(resize_to);
            inflate_s.avail_out = static_cast<unsigned int>(2 * size);
            inflate_s.next_out = reinterpret_cast<Bytef*>(&output[0] + size_uncompressed);
            int ret = inflate(&inflate_s, Z_FINISH);
            if (ret != Z_STREAM_END && ret != Z_OK && ret != Z_BUF_ERROR)
            {
                std::string error_msg = inflate_s.msg;
                inflateEnd(&inflate_s);
                throw std::runtime_error(error_msg);
            }

            size_uncompressed += (2 * size - inflate_s.avail_out);
        } while (inflate_s.avail_out == 0);
        inflateEnd(&inflate_s);
        output.resize(size_uncompressed);
    }